

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module **ppsVar1;
  int iVar2;
  u32 uVar3;
  sqlite3_vtab *psVar4;
  sqlite3_module *psVar5;
  sqlite3_vtab *psVar6;
  Fts5IndexIter *pIndexIter;
  u32 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  u32 nData;
  void *__s1;
  ulong uVar16;
  int iVar17;
  u8 *puVar18;
  long lVar19;
  long in_FS_OFFSET;
  int iOff;
  uint local_50 [2];
  i64 local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = pCursor->pVtab;
  psVar5 = pCursor[2].pVtab[1].pModule;
  iVar2 = *(int *)&psVar5->xDisconnect;
  uVar16 = (ulong)iVar2;
  psVar6 = *(sqlite3_vtab **)(*(long *)&pCursor[2].pVtab[1].nRef + 0xa0);
  iVar15 = (uint)(psVar6 != pCursor[5].pVtab) << 2;
  iVar8 = 4;
  local_3c = iVar15;
  if (psVar6 != pCursor[5].pVtab) goto LAB_001f449d;
  pCursor[0xb].pVtab = (sqlite3_vtab *)((long)&(pCursor[0xb].pVtab)->pModule + 1);
  iVar17 = psVar4[2].nRef;
  if (iVar17 == 0) {
    iVar8 = *(int *)((long)&pCursor[8].pVtab + 4);
    uVar11 = (ulong)iVar8;
    iVar8 = iVar8 + 1;
    uVar13 = uVar11;
    if (iVar8 < iVar2) {
      iVar8 = iVar2;
    }
    do {
      if ((long)uVar16 <= (long)(uVar13 + 1)) {
        *(int *)((long)&pCursor[8].pVtab + 4) = iVar8;
        goto LAB_001f4591;
      }
      uVar9 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar9;
      lVar19 = uVar13 * 2;
      uVar13 = uVar13 + 1;
    } while (*(long *)(&(pCursor[10].pVtab)->nRef + lVar19) == 0);
    *(uint *)((long)&pCursor[8].pVtab + 4) = uVar9;
    if (iVar2 <= (int)uVar9) goto LAB_001f4591;
    iVar17 = 0;
  }
  else {
    if (iVar17 == 2) {
      iVar2 = *(int *)((long)&psVar5->xBegin + 4);
      psVar4 = pCursor[4].pVtab;
      do {
        if ((iVar2 != 1) &&
           (iVar8 = sqlite3Fts5PoslistNext64
                              (*(u8 **)&psVar4->nRef,*(int *)&psVar4->zErrMsg,(int *)(pCursor + 0xf)
                               ,(i64 *)(pCursor + 0xe)), iVar8 == 0)) goto LAB_001f4652;
        pCursor[0xe].pVtab = (sqlite3_vtab *)0x0;
        *(undefined4 *)&pCursor[0xf].pVtab = 0;
        iVar8 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
        if (iVar8 != 0) break;
        iVar8 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
        if ((iVar2 == 1) || (*(int *)&pCursor[3].pVtab != 0)) goto LAB_001f449d;
      } while (iVar8 == 0);
      *(undefined4 *)&pCursor[3].pVtab = 1;
      goto LAB_001f449d;
    }
LAB_001f4591:
    psVar6 = pCursor[4].pVtab;
    if (*(char *)((long)&psVar6->zErrMsg + 4) == '\0') {
      lVar14 = (ulong)*(ushort *)&(psVar6[4].pModule)->field_0x4 * 0x80;
      lVar19 = *(long *)((long)psVar6 + lVar14 + 200);
      nData = *(int *)((long)psVar6 + lVar14 + 0xd0) - 1;
      puVar18 = (u8 *)(lVar19 + 1);
      if (lVar19 == 0) {
        puVar18 = (u8 *)0x0;
      }
      uVar3 = *(u32 *)&pCursor[6].pVtab;
      if (-1 < (int)uVar3) {
        uVar7 = uVar3;
        if ((int)nData < (int)uVar3) {
          uVar7 = nData;
        }
        iVar8 = memcmp(pCursor[7].pVtab,puVar18,(long)(int)uVar7);
        if ((iVar8 < 0) || ((int)uVar3 < (int)nData && iVar8 == 0)) {
          *(undefined4 *)&pCursor[3].pVtab = 1;
LAB_001f4652:
          iVar8 = 0;
          goto LAB_001f449d;
        }
      }
      *(undefined4 *)&pCursor[0xd].pVtab = 0;
      sqlite3Fts5BufferAppendBlob(&local_3c,(Fts5Buffer *)(pCursor + 0xc),nData,puVar18);
      memset(pCursor[9].pVtab,0,uVar16 * 8);
      memset(pCursor[10].pVtab,0,uVar16 * 8);
      *(undefined4 *)((long)&pCursor[8].pVtab + 4) = 0;
      iVar8 = local_3c;
      if (local_3c == 0) {
        iVar17 = psVar4[2].nRef;
        do {
          iVar8 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xBegin + 4);
          local_48 = 0;
          local_50[1] = 0;
          pIndexIter = (Fts5IndexIter *)pCursor[4].pVtab;
          puVar18 = pIndexIter->pData;
          iVar15 = pIndexIter->nData;
          if (iVar17 == 0) {
            if (iVar8 == 0) {
              iVar8 = sqlite3Fts5PoslistNext64(puVar18,iVar15,(int *)(local_50 + 1),&local_48);
              if (iVar8 == 0) {
                uVar9 = 0xffffffff;
                do {
                  uVar10 = (uint)((ulong)local_48 >> 0x20);
                  uVar12 = uVar10 & 0x7fffffff;
                  if (uVar9 == uVar12) {
                    uVar13 = (ulong)(uVar10 & 0x7fffffff);
                  }
                  else {
                    if (iVar2 <= (int)uVar12) goto LAB_001f48c9;
                    uVar13 = (ulong)(uVar10 & 0x7fffffff);
                    ppsVar1 = &(pCursor[10].pVtab)->pModule + uVar13;
                    *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
                    uVar9 = uVar12;
                  }
                  ppsVar1 = &(pCursor[9].pVtab)->pModule + uVar13;
                  *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
                  iVar8 = sqlite3Fts5PoslistNext64(puVar18,iVar15,(int *)(local_50 + 1),&local_48);
                } while (iVar8 == 0);
              }
            }
            else {
              if (iVar8 != 2) goto LAB_001f47af;
              while (iVar8 = sqlite3Fts5PoslistNext64
                                       (puVar18,iVar15,(int *)(local_50 + 1),&local_48), iVar8 == 0)
              {
                if ((long)uVar16 <= local_48) goto LAB_001f48c9;
                ppsVar1 = &(pCursor[10].pVtab)->pModule + local_48;
                *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
              }
            }
          }
          else if (iVar17 == 1) {
            if (((iVar8 == 0) && (((ulong)pCursor[8].pVtab & 4) != 0)) && (0 < iVar15)) {
              lVar19 = 0;
              do {
                local_50[0] = (uint)puVar18[lVar19];
                uVar13 = 1;
                if ((char)puVar18[lVar19] < '\0') {
                  uVar9 = sqlite3Fts5GetVarint32(puVar18 + lVar19,local_50);
                  uVar13 = (ulong)uVar9;
                }
                lVar19 = lVar19 + uVar13;
                if (local_50[0] == 1) {
                  if ((char)puVar18[lVar19] < '\0') {
                    uVar9 = sqlite3Fts5GetVarint32(puVar18 + lVar19,local_50);
                    lVar19 = lVar19 + (ulong)uVar9;
                  }
                  else {
                    lVar19 = lVar19 + 1;
                  }
                }
                else {
                  (pCursor[9].pVtab)->pModule =
                       (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
                }
              } while (lVar19 < iVar15);
            }
LAB_001f47af:
            (pCursor[10].pVtab)->pModule =
                 (sqlite3_module *)((long)&(pCursor[10].pVtab)->pModule->iVersion + 1);
          }
          iVar15 = sqlite3Fts5IterNextScan(pIndexIter);
          iVar17 = psVar4[2].nRef;
          if (iVar17 == 2) {
            iVar17 = 2;
            goto LAB_001f45a2;
          }
          iVar8 = iVar15;
          if (iVar15 != 0) break;
          psVar6 = pCursor[4].pVtab;
          lVar19 = (ulong)*(ushort *)&(psVar6[4].pModule)->field_0x4 * 0x80;
          iVar8 = *(int *)((long)psVar6 + lVar19 + 0xd0);
          lVar19 = *(long *)((long)psVar6 + lVar19 + 200);
          __s1 = (void *)(lVar19 + 1);
          if (lVar19 == 0) {
            __s1 = (void *)0x0;
          }
          uVar9 = iVar8 - 1;
          iVar15 = 0;
          if (((uVar9 != *(uint *)&pCursor[0xd].pVtab) ||
              ((1 < iVar8 &&
               (iVar8 = bcmp(__s1,((Fts5Buffer *)(pCursor + 0xc))->p,(ulong)uVar9), iVar8 != 0))))
             || (*(char *)((long)&psVar6->zErrMsg + 4) != '\0')) goto LAB_001f45a2;
        } while( true );
      }
      goto LAB_001f449d;
    }
    *(undefined4 *)&pCursor[3].pVtab = 1;
  }
LAB_001f45a2:
  iVar8 = iVar15;
  if ((iVar15 == 0) && (iVar8 = 0, iVar17 == 0 && *(int *)&pCursor[3].pVtab == 0)) {
    uVar9 = *(uint *)((long)&pCursor[8].pVtab + 4);
    uVar13 = (ulong)uVar9;
    if ((int)uVar9 < iVar2) {
      uVar13 = (ulong)(int)uVar9;
      psVar4 = pCursor[10].pVtab;
      do {
        if ((&psVar4->pModule)[uVar13] != (sqlite3_module *)0x0) goto LAB_001f48b6;
        iVar15 = (int)uVar13;
        uVar13 = uVar13 + 1;
        *(int *)((long)&pCursor[8].pVtab + 4) = iVar15 + 1;
      } while (uVar16 != uVar13);
    }
    else {
LAB_001f48b6:
      if ((int)uVar13 != iVar2) goto LAB_001f449d;
    }
    iVar8 = 0x10b;
  }
LAB_001f449d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
LAB_001f48c9:
  iVar8 = 0x10b;
  goto LAB_001f449d;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int nCol = pCsr->pFts5->pConfig->nCol;
  int rc;

  rc = sqlite3Fts5StructureTest(pCsr->pFts5->pIndex, pCsr->pStruct);
  if( rc!=SQLITE_OK ) return rc;
  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            /* Do not bother counting the number of instances if the "cnt"
            ** column is not being read (according to colUsed).  */
            if( eDetail==FTS5_DETAIL_FULL && (pCsr->colUsed & 0x04) ){
              while( iPos<nPos ){
                u32 ii;
                fts5FastGetVarint32(pPos, iPos, ii);
                if( ii==1 ){
                  /* New column in the position list */
                  fts5FastGetVarint32(pPos, iPos, ii);
                }else{
                  /* An instance - increment pCsr->aCnt[] */
                  pCsr->aCnt[0]++;
                }
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm))
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}